

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_create_function(jx9_vm *pVm,char *zName,
                       _func_int_jx9_context_ptr_int_jx9_value_ptr_ptr *xFunc,void *pUserData)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  char *pcVar6;
  long lVar7;
  SyString local_40;
  
  if (pVm == (jx9_vm *)0x0) {
    return -0x18;
  }
  if (pVm->nMagic == 0xdead2bad) {
    return -0x18;
  }
  pcVar6 = zName;
  if (*zName != '\0') {
    pcVar2 = zName + 2;
    do {
      pcVar6 = pcVar2;
      if (pcVar6[-1] == '\0') {
        pcVar6 = pcVar6 + -1;
        goto LAB_00118dac;
      }
      if (*pcVar6 == '\0') goto LAB_00118dac;
      if (pcVar6[1] == '\0') {
        pcVar6 = pcVar6 + 1;
        goto LAB_00118dac;
      }
      pcVar2 = pcVar6 + 4;
    } while (pcVar6[2] != '\0');
    pcVar6 = pcVar6 + 2;
  }
LAB_00118dac:
  uVar3 = (int)pcVar6 - (int)zName;
  if (uVar3 == 0) {
    return -0x18;
  }
  lVar7 = 0;
  while ((cVar1 = zName[lVar7], (ulong)(long)cVar1 < 0xffffffffffffffc0 &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0))
        ) {
    lVar7 = lVar7 + 1;
    if (uVar3 == (uint)lVar7) {
      return -0x18;
    }
  }
  local_40.zString = zName + lVar7;
  pcVar6 = zName + uVar3;
  lVar7 = (ulong)uVar3 - lVar7;
  while( true ) {
    pcVar6 = pcVar6 + -1;
    cVar1 = *pcVar6;
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0))
    break;
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      return -0x18;
    }
  }
  local_40.nByte = (uint)lVar7;
  if (xFunc == (_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr *)0x0) {
    return -0x18;
  }
  sVar4 = jx9VmInstallForeignFunction(pVm,&local_40,xFunc,pUserData);
  return sVar4;
}

Assistant:

JX9_PRIVATE int jx9_create_function(jx9_vm *pVm, const char *zName, int (*xFunc)(jx9_context *, int, jx9_value **), void *pUserData)
{
	SyString sName;
	int rc;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return JX9_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	/* Ticket 1433-003: NULL values are not allowed */
	if( sName.nByte < 1 || xFunc == 0 ){
		return JX9_CORRUPT;
	}
#if defined(JX9_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sJx9MPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
	 if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE && 
		 JX9_THRD_VM_RELEASE(pVm) ){
			 return JX9_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Install the foreign function */
	rc = jx9VmInstallForeignFunction(&(*pVm), &sName, xFunc, pUserData); 
#if defined(JX9_ENABLE_THREADS)
	 /* Leave VM mutex */
	 SyMutexLeave(sJx9MPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
#endif
	return rc;
}